

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeFenceDestroyPrologue
          (ZEHandleLifetimeValidation *this,ze_fence_handle_t hFence)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = context;
  if ((hFence == (ze_fence_handle_t)0x0) ||
     (bVar2 = HandleLifetimeValidation::isHandleValid
                        (*(HandleLifetimeValidation **)(context + 0xd48),hFence), !bVar2)) {
    bVar2 = HandleLifetimeValidation::isHandleValid
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hFence);
    if (!bVar2) {
      return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    }
  }
  else {
    bVar2 = HandleLifetimeValidation::hasDependents
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hFence);
    if (bVar2) {
      return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
    }
    HandleLifetimeValidation::removeDependent(*(HandleLifetimeValidation **)(lVar1 + 0xd48),hFence);
    HandleLifetimeValidation::removeHandle(*(HandleLifetimeValidation **)(lVar1 + 0xd48),hFence);
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeFenceDestroyPrologue(
        ze_fence_handle_t hFence                        ///< [in][release] handle of fence object to destroy
        )
    { 
        
        if (hFence && context.handleLifetime->isHandleValid( hFence )){
            if (context.handleLifetime->hasDependents( hFence )){
                return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
            }
            context.handleLifetime->removeDependent( hFence);
            context.handleLifetime->removeHandle( hFence );
        } else if (!context.handleLifetime->isHandleValid( hFence )) {
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }